

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

bool __thiscall
amrex::BoxArray::contains(BoxArray *this,BoxArray *ba,bool assume_disjoint_ba,IntVect *ng)

{
  bool bVar1;
  Long LVar2;
  Box *this_00;
  IntVect *in_RCX;
  byte in_DL;
  int N;
  int i;
  IntVect *in_stack_00000058;
  bool in_stack_00000067;
  Box *in_stack_00000068;
  BoxArray *in_stack_000000e8;
  int in_stack_ffffffffffffff7c;
  BoxArray *in_stack_ffffffffffffff80;
  int local_64;
  Box local_60;
  Box local_44;
  IntVect *local_28;
  byte local_19;
  bool local_1;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  LVar2 = size((BoxArray *)0x1264476);
  if (LVar2 == 0) {
    local_1 = false;
  }
  else {
    minimalBox(in_stack_000000e8);
    this_00 = Box::grow(&local_44,local_28);
    minimalBox(in_stack_000000e8);
    bVar1 = Box::contains(this_00,&local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_64 = 0;
      LVar2 = size((BoxArray *)0x12644f2);
      for (; local_64 < (int)LVar2; local_64 = local_64 + 1) {
        operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        bVar1 = contains((BoxArray *)ng,in_stack_00000068,in_stack_00000067,in_stack_00000058);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool
BoxArray::contains (const BoxArray& ba, bool assume_disjoint_ba, const IntVect& ng) const
{
    if (size() == 0) return false;

    if (!minimalBox().grow(ng).contains(ba.minimalBox())) return false;

    for (int i = 0, N = ba.size(); i < N; ++i) {
        if (!contains(ba[i],assume_disjoint_ba, ng)) {
            return false;
        }
    }

    return true;
}